

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_funcs.c
# Opt level: O0

ktx_error_code_e ktxLoadOpenGL(PFNGLGETPROCADDRESS pfnGLGetProcAddress)

{
  ktx_error_code_e kVar1;
  code *in_RDI;
  ktx_error_code_e result;
  code *local_10;
  ktx_error_code_e local_4;
  
  if (openGLLoaded) {
    local_4 = KTX_SUCCESS;
  }
  else {
    local_10 = in_RDI;
    if (in_RDI == (code *)0x0) {
      kVar1 = ktxLoadOpenGLLibrary();
      if (kVar1 != KTX_SUCCESS) {
        return kVar1;
      }
      local_10 = defaultGLGetProcAddress;
    }
    gl.glBindTexture = (PFNGLBINDTEXTUREPROC)(*local_10)("glBindTexture");
    if (gl.glBindTexture == (PFNGLBINDTEXTUREPROC)0x0) {
      fprintf(_stderr,noloadmsg,"glBindTexture");
      local_4 = KTX_NOT_FOUND;
    }
    else {
      gl.glCompressedTexImage1D =
           (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*local_10)("glCompressedTexImage1D");
      gl.glCompressedTexImage2D =
           (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*local_10)("glCompressedTexImage2D");
      if (gl.glCompressedTexImage2D == (PFNGLCOMPRESSEDTEXIMAGE2DPROC)0x0) {
        fprintf(_stderr,noloadmsg,"glCompressedTexImage2D");
        local_4 = KTX_NOT_FOUND;
      }
      else {
        gl.glCompressedTexImage3D =
             (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*local_10)("glCompressedTexImage3D");
        gl.glCompressedTexSubImage1D =
             (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*local_10)("glCompressedTexSubImage1D");
        gl.glCompressedTexSubImage2D =
             (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*local_10)("glCompressedTexSubImage2D");
        if (gl.glCompressedTexSubImage2D == (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)0x0) {
          fprintf(_stderr,noloadmsg,"glCompressedTexSubImage2D");
          local_4 = KTX_NOT_FOUND;
        }
        else {
          gl.glCompressedTexSubImage3D =
               (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*local_10)("glCompressedTexSubImage3D");
          gl.glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*local_10)("glDeleteTextures");
          if (gl.glDeleteTextures == (PFNGLDELETETEXTURESPROC)0x0) {
            fprintf(_stderr,noloadmsg,"glDeleteTextures");
            local_4 = KTX_NOT_FOUND;
          }
          else {
            gl.glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*local_10)("glGenerateMipmap");
            gl.glGenTextures = (PFNGLGENTEXTURESPROC)(*local_10)("glGenTextures");
            if (gl.glGenTextures == (PFNGLGENTEXTURESPROC)0x0) {
              fprintf(_stderr,noloadmsg,"glGenTextures");
              local_4 = KTX_NOT_FOUND;
            }
            else {
              gl.glGetError = (PFNGLGETERRORPROC)(*local_10)("glGetError");
              if (gl.glGetError == (PFNGLGETERRORPROC)0x0) {
                fprintf(_stderr,noloadmsg,"glGetError");
                local_4 = KTX_NOT_FOUND;
              }
              else {
                gl.glGetIntegerv = (PFNGLGETINTEGERVPROC)(*local_10)("glGetIntegerv");
                if (gl.glGetIntegerv == (PFNGLGETINTEGERVPROC)0x0) {
                  fprintf(_stderr,noloadmsg,"glGetIntegerv");
                  local_4 = KTX_NOT_FOUND;
                }
                else {
                  gl.glGetString = (PFNGLGETSTRINGPROC)(*local_10)("glGetString");
                  if (gl.glGetString == (PFNGLGETSTRINGPROC)0x0) {
                    fprintf(_stderr,noloadmsg,"glGetString");
                    local_4 = KTX_NOT_FOUND;
                  }
                  else {
                    gl.glGetStringi = (PFNGLGETSTRINGIPROC)(*local_10)("glGetStringi");
                    gl.glPixelStorei = (PFNGLPIXELSTOREIPROC)(*local_10)("glPixelStorei");
                    if (gl.glPixelStorei == (PFNGLPIXELSTOREIPROC)0x0) {
                      fprintf(_stderr,noloadmsg,"glPixelStorei");
                      local_4 = KTX_NOT_FOUND;
                    }
                    else {
                      gl.glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*local_10)("glTexImage1D");
                      gl.glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*local_10)("glTexImage2D");
                      if (gl.glTexImage2D == (PFNGLTEXIMAGE2DPROC)0x0) {
                        fprintf(_stderr,noloadmsg,"glTexImage2D");
                        local_4 = KTX_NOT_FOUND;
                      }
                      else {
                        gl.glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*local_10)("glTexImage3D");
                        gl.glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*local_10)("glTexParameteri");
                        if (gl.glTexParameteri == (PFNGLTEXPARAMETERIPROC)0x0) {
                          fprintf(_stderr,noloadmsg,"glTexParameteri");
                          local_4 = KTX_NOT_FOUND;
                        }
                        else {
                          gl.glTexParameteriv =
                               (PFNGLTEXPARAMETERIVPROC)(*local_10)("glTexParameteriv");
                          if (gl.glTexParameteriv == (PFNGLTEXPARAMETERIVPROC)0x0) {
                            fprintf(_stderr,noloadmsg,"glTexParameteriv");
                            local_4 = KTX_NOT_FOUND;
                          }
                          else {
                            gl.glTexStorage1D = (PFNGLTEXSTORAGE1DPROC)(*local_10)("glTexStorage1D")
                            ;
                            gl.glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)(*local_10)("glTexStorage2D")
                            ;
                            gl.glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)(*local_10)("glTexStorage3D")
                            ;
                            gl.glTexSubImage1D =
                                 (PFNGLTEXSUBIMAGE1DPROC)(*local_10)("glTexSubImage1D");
                            gl.glTexSubImage2D =
                                 (PFNGLTEXSUBIMAGE2DPROC)(*local_10)("glTexSubImage2D");
                            if (gl.glTexSubImage2D == (PFNGLTEXSUBIMAGE2DPROC)0x0) {
                              fprintf(_stderr,noloadmsg,"glTexSubImage2D");
                              local_4 = KTX_NOT_FOUND;
                            }
                            else {
                              gl.glTexSubImage3D =
                                   (PFNGLTEXSUBIMAGE3DPROC)(*local_10)("glTexSubImage3D");
                              openGLLoaded = true;
                              local_4 = KTX_SUCCESS;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

ktx_error_code_e
ktxLoadOpenGL(PFNGLGETPROCADDRESS pfnGLGetProcAddress)
{
    if (openGLLoaded)
        return KTX_SUCCESS;

    if (!pfnGLGetProcAddress) {
        ktx_error_code_e result = ktxLoadOpenGLLibrary();
        if (result != KTX_SUCCESS) {
            return result;
        }
        pfnGLGetProcAddress = defaultGLGetProcAddress;
    }

    // Load function pointers

#include "gl_funclist.inl"

    openGLLoaded = true;
    return KTX_SUCCESS;
}